

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O0

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,CompilationUnitSyntax *syntax)

{
  long in_RSI;
  long in_RDI;
  CompilationUnitSyntax *in_stack_00000028;
  SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *in_stack_00000030;
  
  *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(in_RSI + 0x50);
  *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(in_RSI + 0x58);
  slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
  visitDefault<slang::syntax::CompilationUnitSyntax_const&>(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void handle(const CompilationUnitSyntax& syntax) {
        meta.eofToken = syntax.endOfFile;
        visitDefault(syntax);
    }